

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodetree.c
# Opt level: O0

nodetree * NodeTree_DetachAndRelease(void *p)

{
  nodetree *pnVar1;
  nodetree *Next;
  void *p_local;
  
  if (p == *(void **)((long)p + 0x28)) {
    __assert_fail("(nodetree*)(p) != ((nodetree*)(p))->Next",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/nodetree.c"
                  ,0x1f,"nodetree *NodeTree_DetachAndRelease(void *)");
  }
  pnVar1 = *(nodetree **)((long)p + 0x28);
  if (p != (void *)0x0) {
    (**(code **)(*(long *)((long)p + 8) + 0x48))(p,0);
    Node_Release(p);
    return pnVar1;
  }
  __assert_fail("(const void*)(p)!=NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/nodetree.c"
                ,0x20,"nodetree *NodeTree_DetachAndRelease(void *)");
}

Assistant:

nodetree* NodeTree_DetachAndRelease(void* p)
{
    nodetree* Next = NodeTree_Next(p);
    NodeTree_SetParent(p,NULL,NULL);
    Node_Release(p);
    return Next;
}